

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O3

void __thiscall Block::toString(Block *this)

{
  size_type *psVar1;
  pointer pRVar2;
  pointer pcVar3;
  ostream *poVar4;
  pointer pRVar5;
  size_type *local_58;
  Record r;
  
  pRVar5 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar5 != pRVar2) {
    psVar1 = &r.tconst._M_string_length;
    do {
      pcVar3 = (pRVar5->tconst)._M_dataplus._M_p;
      local_58 = psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar3,pcVar3 + (pRVar5->tconst)._M_string_length);
      r.tconst.field_2._8_4_ = pRVar5->averageRating;
      r.tconst.field_2._12_4_ = pRVar5->numVotes;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_58,(long)r.tconst._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ,",2);
      if (local_58 != psVar1) {
        operator_delete(local_58);
      }
      pRVar5 = pRVar5 + 1;
    } while (pRVar5 != pRVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

void Block::toString() {
    for (Record r : records) {
        std::cout << r.tconst << " ,";
    }
    std::cout << std::endl;
}